

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall TimerNode::clearReq(TimerNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = (this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->deleted_ = true;
  return;
}

Assistant:

void TimerNode::clearReq() {
  SPHttpData.reset();
  this->setDeleted();
}